

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt_algebraic.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_6c02f::ir_algebraic_visitor::reassociate_operands
          (ir_algebraic_visitor *this,ir_expression *ir1,int op1,ir_expression *ir2,int op2)

{
  ir_rvalue *piVar1;
  ir_rvalue *temp;
  int op2_local;
  ir_expression *ir2_local;
  int op1_local;
  ir_expression *ir1_local;
  ir_algebraic_visitor *this_local;
  
  piVar1 = ir2->operands[op2];
  ir2->operands[op2] = ir1->operands[op1];
  ir1->operands[op1] = piVar1;
  update_type(ir2);
  this->progress = true;
  return;
}

Assistant:

void
ir_algebraic_visitor::reassociate_operands(ir_expression *ir1,
					   int op1,
					   ir_expression *ir2,
					   int op2)
{
   ir_rvalue *temp = ir2->operands[op2];
   ir2->operands[op2] = ir1->operands[op1];
   ir1->operands[op1] = temp;

   /* Update the type of ir2.  The type of ir1 won't have changed --
    * base types matched, and at least one of the operands of the 2
    * binops is still a vector if any of them were.
    */
   update_type(ir2);

   this->progress = true;
}